

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  const_iterator cVar5;
  long *plVar6;
  const_iterator cVar7;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var8;
  ulong uVar9;
  ulong *puVar10;
  size_type *psVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  _Base_ptr p_Var14;
  _Alloc_hider _Var15;
  _Base_ptr __rhs;
  _Alloc_hider _Var16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  String *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  _Base_ptr local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  pointer local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_f0;
  undefined2 *local_e8;
  _Base_ptr local_e0;
  undefined2 local_d8;
  undefined1 local_d6;
  undefined1 *local_c8;
  ulong local_c0;
  undefined1 local_b8 [16];
  Options *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Base_ptr local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_40;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_38;
  
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  local_a8 = this;
  if ((_Rb_tree_header *)cVar5._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_170 = __return_storage_ptr__;
    if (g->_M_string_length != 0) {
      std::operator+(&local_118," ",g);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
      paVar2 = &local_190.field_2;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_190.field_2._M_allocated_capacity = *puVar10;
        local_190.field_2._8_8_ = plVar6[3];
        local_190._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *puVar10;
        local_190._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_160.first._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      paVar3 = &local_160.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p == paVar2) {
        local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
        local_160.first._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
      }
      local_160.first.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
      local_190._M_string_length = 0;
      local_190.field_2._M_allocated_capacity =
           local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_190._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.first._M_dataplus._M_p != paVar3) {
        operator_delete(local_160.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    __rhs = *(_Base_ptr *)(cVar5._M_node + 4);
    local_120 = cVar5._M_node[4]._M_parent;
    local_168 = paVar1;
    local_f8 = (pointer)cVar5;
    if (__rhs == local_120) {
      p_Var14 = (_Base_ptr)0x0;
    }
    else {
      local_f0 = &(local_a8->m_positional_set)._M_h;
      paVar1 = &local_160.first.field_2;
      paVar2 = &local_190.field_2;
      p_Var14 = (_Base_ptr)0x0;
      do {
        cVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(local_f0,(key_type *)(__rhs + 1));
        if ((cVar7.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0) || (local_a8->m_show_positional != false)) {
          local_e8 = &local_d8;
          local_d8 = 0x2020;
          local_e0 = (_Base_ptr)0x2;
          local_d6 = 0;
          if (__rhs->_M_parent == (_Base_ptr)0x0) {
            std::__cxx11::string::append((char *)&local_e8);
          }
          else {
            std::operator+(&local_190,"-",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_190);
            puVar10 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_160.first.field_2._M_allocated_capacity = *puVar10;
              local_160.first.field_2._8_8_ = plVar6[3];
              local_160.first._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_160.first.field_2._M_allocated_capacity = *puVar10;
              local_160.first._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_160.first._M_string_length = plVar6[1];
            *plVar6 = (long)puVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&local_e8,(ulong)local_160.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != paVar1) {
              operator_delete(local_160.first._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != paVar2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
          }
          if (__rhs[1]._M_parent != (_Base_ptr)0x0) {
            std::operator+(&local_160.first," --",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (__rhs + 1));
            std::__cxx11::string::_M_append
                      ((char *)&local_e8,(ulong)local_160.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != paVar1) {
              operator_delete(local_160.first._M_dataplus._M_p);
            }
          }
          if (__rhs[5]._M_right == (_Base_ptr)0x0) {
            local_160.first._M_string_length = 3;
            local_160.first.field_2._M_allocated_capacity._0_4_ = 0x677261;
            local_160.first._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_160.first._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_160,__rhs[5]._M_left,
                       (long)&(__rhs[5]._M_left)->_M_color + (long)&(__rhs[5]._M_right)->_M_color);
          }
          if (*(char *)((long)&__rhs[6]._M_left + 1) == '\0') {
            if (*(char *)&__rhs[4]._M_parent == '\x01') {
              std::operator+(&local_78," [=",&local_160.first);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              psVar11 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_a0.field_2._M_allocated_capacity = *psVar11;
                local_a0.field_2._8_8_ = plVar6[3];
              }
              else {
                local_a0.field_2._M_allocated_capacity = *psVar11;
                local_a0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_a0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar11;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_a0,(ulong)__rhs[4]._M_left);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              puVar10 = (ulong *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar10) {
                local_118.field_2._M_allocated_capacity = *puVar10;
                local_118.field_2._8_8_ = plVar6[3];
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar10;
                local_118._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_118._M_string_length = plVar6[1];
              *plVar6 = (long)puVar10;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
              puVar10 = (ulong *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar10) {
                local_190.field_2._M_allocated_capacity = *puVar10;
                local_190.field_2._8_8_ = plVar6[3];
                local_190._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_190.field_2._M_allocated_capacity = *puVar10;
                local_190._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_190._M_string_length = plVar6[1];
              *plVar6 = (long)puVar10;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_190._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != paVar2) {
                operator_delete(local_190._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
              _Var12._M_p = local_78._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_00117ca6:
                operator_delete(_Var12._M_p);
              }
            }
            else {
              std::operator+(&local_190," ",&local_160.first);
              std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_190._M_dataplus._M_p);
              _Var12._M_p = local_190._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != paVar2) goto LAB_00117ca6;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
          if (p_Var14 <= local_e0) {
            p_Var14 = local_e0;
          }
          local_190._M_string_length = 0;
          local_190.field_2._M_allocated_capacity =
               local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_190._M_dataplus._M_p = (pointer)paVar2;
          local_160.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_e8,(long)&local_e0->_M_color + (long)local_e8);
          local_160.second._M_dataplus._M_p = (pointer)&local_160.second.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p == paVar2) {
            local_160.second.field_2._8_8_ = local_190.field_2._8_8_;
          }
          else {
            local_160.second._M_dataplus._M_p = local_190._M_dataplus._M_p;
          }
          local_160.second.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
          local_160.second._M_string_length = local_190._M_string_length;
          local_190._M_string_length = 0;
          local_190.field_2._M_allocated_capacity =
               local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_190._M_dataplus._M_p = (pointer)paVar2;
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_58,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.second._M_dataplus._M_p != &local_160.second.field_2) {
            operator_delete(local_160.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8);
          }
        }
        __rhs = (_Base_ptr)&__rhs[6]._M_right;
      } while (__rhs != local_120);
    }
    local_80 = (_Base_ptr)0x1e;
    if (p_Var14 < (_Base_ptr)0x1e) {
      local_80 = p_Var14;
    }
    p_Var8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_f8[2].first._M_dataplus._M_p;
    local_38 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_f8[2].first._M_string_length;
    __return_storage_ptr__ = local_170;
    if (p_Var8 != local_38) {
      uVar13 = 0x4a - (long)local_80;
      local_f8 = local_58.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_40 = &(local_a8->m_positional_set)._M_h;
      local_120 = (_Base_ptr)((long)&local_80->_M_color + 2);
      do {
        local_f0 = p_Var8;
        cVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(local_40,(key_type *)&p_Var8->_M_rehash_policy);
        p_Var8 = local_f0;
        if ((cVar7.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0) || (local_a8->m_show_positional != false)) {
          local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_f0[1]._M_bucket_count,
                     (long)&(local_f0[1]._M_before_begin._M_nxt)->_M_nxt +
                     local_f0[1]._M_bucket_count);
          if (((char)p_Var8[1]._M_rehash_policy._M_next_resize == '\x01') &&
             ((*(char *)((long)&p_Var8[3]._M_rehash_policy._M_next_resize + 1) != '\x01' ||
              (iVar4 = std::__cxx11::string::compare((char *)&p_Var8[1]._M_single_bucket),
              p_Var8 = local_f0, iVar4 != 0)))) {
            std::operator+(&local_a0," (default: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_Var8[1]._M_single_bucket);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
            paVar1 = &local_118.field_2;
            puVar10 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_118.field_2._M_allocated_capacity = *puVar10;
              local_118.field_2._8_8_ = plVar6[3];
              local_118._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_118.field_2._M_allocated_capacity = *puVar10;
              local_118._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_190._M_string_length = plVar6[1];
            *plVar6 = (long)puVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p == paVar1) {
              local_190.field_2._8_8_ = local_118.field_2._8_8_;
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            }
            else {
              local_190._M_dataplus._M_p = local_118._M_dataplus._M_p;
            }
            local_190.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
            local_118._M_string_length = 0;
            local_118.field_2._M_allocated_capacity =
                 local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_118._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_190._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar1) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
          }
          local_c8 = local_b8;
          local_c0 = 0;
          local_b8[0] = 0;
          _Var12._M_p = local_160.first._M_dataplus._M_p;
          if (local_160.first._M_string_length != 0) {
            uVar9 = 0;
            _Var15._M_p = local_160.first._M_dataplus._M_p;
            _Var16._M_p = local_160.first._M_dataplus._M_p;
            do {
              if (*_Var16._M_p == ' ') {
                _Var15._M_p = _Var16._M_p;
              }
              if (*_Var16._M_p == '\n') {
                _Var12._M_p = _Var16._M_p + 1;
                _Var15._M_p = _Var12._M_p;
              }
              else if (uVar13 < uVar9) {
                if (_Var15._M_p == _Var12._M_p) {
                  std::__cxx11::string::replace
                            ((ulong)&local_c8,local_c0,(char *)0x0,(ulong)_Var12._M_p);
                  paVar1 = &local_78.field_2;
                  local_78.field_2._M_allocated_capacity._0_2_ = 10;
                  local_78._M_string_length = 1;
                  local_78._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_append((char *)&local_c8,(ulong)paVar1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != paVar1) {
                    operator_delete(local_78._M_dataplus._M_p);
                  }
                  std::__cxx11::string::_M_replace_aux((ulong)&local_c8,local_c0,0,(char)local_120);
                  _Var12._M_p = _Var16._M_p + 1;
                  _Var15._M_p = _Var12._M_p;
                }
                else {
                  std::__cxx11::string::replace
                            ((ulong)&local_c8,local_c0,(char *)0x0,(ulong)_Var12._M_p);
                  local_d8 = 10;
                  local_e0 = (_Base_ptr)0x1;
                  local_e8 = &local_d8;
                  std::__cxx11::string::_M_append((char *)&local_c8,(ulong)&local_d8);
                  if (local_e8 != &local_d8) {
                    operator_delete(local_e8);
                  }
                  std::__cxx11::string::_M_replace_aux((ulong)&local_c8,local_c0,0,(char)local_120);
                  _Var12._M_p = _Var15._M_p + 1;
                }
                uVar9 = 0;
              }
              else {
                uVar9 = uVar9 + 1;
              }
              _Var16._M_p = _Var16._M_p + 1;
            } while (_Var16._M_p !=
                     local_160.first._M_dataplus._M_p + local_160.first._M_string_length);
          }
          std::__cxx11::string::replace((ulong)&local_c8,local_c0,(char *)0x0,(ulong)_Var12._M_p);
          __return_storage_ptr__ = local_170;
          paVar1 = &local_160.first.field_2;
          paVar2 = &local_190.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(local_f8->first)._M_dataplus._M_p);
          if (local_80 < (_Base_ptr)(local_f8->first)._M_string_length) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            local_190._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p == paVar2) {
              local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
              local_160.first._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
            }
            local_160.first.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
            local_160.first._M_string_length = local_190._M_string_length;
            local_190._M_string_length = 0;
            local_190.field_2._M_allocated_capacity =
                 local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_190._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
          }
          else {
            local_190._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_190,
                       (char)local_120 - (char)(_Base_ptr)(local_f8->first)._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p == paVar2) {
              local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
              local_160.first._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
            }
            local_160.first.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
            local_160.first._M_string_length = local_190._M_string_length;
            local_190._M_string_length = 0;
            local_190.field_2._M_allocated_capacity =
                 local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_190._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          if (local_c8 != local_b8) {
            operator_delete(local_c8);
          }
          local_f8 = local_f8 + 1;
        }
        p_Var8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&local_f0[3]._M_single_bucket;
      } while (p_Var8 != local_38);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String Options::help_one_group(const std::string &g) const {
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end()) {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty()) {
    result += toLocalString(" " + g + " options:\n");
  }

  for (const auto &o : group->second.options) {
    if (m_positional_set.find(o.l) != m_positional_set.end() &&
        !m_show_positional) {
      continue;
    }

    auto s = format_option(o);
    longest = (std::max)(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = (std::min)(longest, static_cast<size_t>(OPTION_LONGEST));

  // widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto &o : group->second.options) {
    if (m_positional_set.find(o.l) != m_positional_set.end() &&
        !m_show_positional) {
      continue;
    }

    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest) {
      result += '\n';
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    } else {
      result += toLocalString(std::string(
          longest + OPTION_DESC_GAP - stringLength(fiter->first), ' '));
    }
    result += d;
    result += '\n';

    ++fiter;
  }

  return result;
}